

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.hh
# Opt level: O0

Scalar __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_dihedral_angle
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,HalfedgeHandle _heh)

{
  bool bVar1;
  EdgeHandle _eh;
  VectorT<double,_3> *in_RCX;
  double dVar2;
  double dVar3;
  VectorT<double,_3> local_b0;
  double local_98;
  Scalar da_sin_sign;
  Scalar da_cos;
  Scalar denom;
  BaseHandle local_78;
  BaseHandle local_74;
  undefined1 local_70 [8];
  Normal he;
  Normal n1;
  Normal n0;
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  *this_local;
  double dStack_10;
  HalfedgeHandle _heh_local;
  
  _eh = ArrayKernel::edge_handle((ArrayKernel *)this,(HalfedgeHandle)_heh.super_BaseHandle.idx_);
  bVar1 = PolyConnectivity::is_boundary((PolyConnectivity *)this,_eh);
  if (bVar1) {
    dStack_10 = 0.0;
  }
  else {
    VectorT<double,_3>::VectorT((VectorT<double,_3> *)(n1.super_VectorDataT<double,_3>.values_ + 2))
    ;
    VectorT<double,_3>::VectorT((VectorT<double,_3> *)(he.super_VectorDataT<double,_3>.values_ + 2))
    ;
    VectorT<double,_3>::VectorT((VectorT<double,_3> *)local_70);
    local_74 = _heh.super_BaseHandle.idx_;
    calc_sector_normal(this,_heh,(Normal *)(n1.super_VectorDataT<double,_3>.values_ + 2));
    denom._4_4_ = _heh.super_BaseHandle.idx_;
    local_78.idx_ =
         (int)ArrayKernel::opposite_halfedge_handle((ArrayKernel *)this,_heh.super_BaseHandle.idx_);
    calc_sector_normal(this,(HalfedgeHandle)local_78.idx_,
                       (Normal *)(he.super_VectorDataT<double,_3>.values_ + 2));
    denom._0_4_ = _heh.super_BaseHandle.idx_;
    calc_edge_vector(this,_heh,(Normal *)local_70);
    dVar2 = VectorT<double,_3>::norm
                      ((VectorT<double,_3> *)(n1.super_VectorDataT<double,_3>.values_ + 2));
    dVar3 = VectorT<double,_3>::norm
                      ((VectorT<double,_3> *)(he.super_VectorDataT<double,_3>.values_ + 2));
    da_cos = dVar2 * dVar3;
    if ((da_cos != 0.0) || (NAN(da_cos))) {
      dVar2 = dot<double,3>((VectorT<double,_3> *)(n1.super_VectorDataT<double,_3>.values_ + 2),
                            (VectorT<double,_3> *)(he.super_VectorDataT<double,_3>.values_ + 2));
      da_sin_sign = dVar2 / da_cos;
      cross<double,3>(&local_b0,(OpenMesh *)(n1.super_VectorDataT<double,_3>.values_ + 2),
                      (VectorT<double,_3> *)(he.super_VectorDataT<double,_3>.values_ + 2),in_RCX);
      local_98 = dot<double,3>(&local_b0,(VectorT<double,_3> *)local_70);
      dStack_10 = angle<double>(da_sin_sign,local_98);
    }
    else {
      dStack_10 = 0.0;
    }
  }
  return dStack_10;
}

Assistant:

Scalar calc_dihedral_angle(HalfedgeHandle _heh) const
  {
    if (this->is_boundary(this->edge_handle(_heh)))
    {//the dihedral angle at a boundary edge is 0
      return 0;
    }
    Normal n0, n1, he;
    calc_sector_normal(_heh, n0);
    calc_sector_normal(this->opposite_halfedge_handle(_heh), n1);
    calc_edge_vector(_heh, he);
    Scalar denom = n0.norm()*n1.norm();
    if (denom == Scalar(0))
    {
      return 0;
    }
    Scalar da_cos = dot(n0, n1)/denom;
    //should be normalized, but we need only the sign
    Scalar da_sin_sign = dot(cross(n0, n1), he);
    return angle(da_cos, da_sin_sign);
  }